

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.H
# Opt level: O2

void __thiscall amrex::Geometry::GetFaceArea(Geometry *this,MultiFab *area,int dir)

{
  double dVar1;
  double dVar2;
  double dVar3;
  value_type val;
  IntVect local_10;
  
  if ((this->super_CoordSys).c_sys != cartesian) {
    Abort_host("Geometry::GetFaceArea:: for 3d, only Cartesian is supported");
    return;
  }
  dVar1 = (this->super_CoordSys).dx[0];
  dVar2 = (this->super_CoordSys).dx[2];
  if (dir == 1) {
    val = dVar1 * dVar2;
  }
  else {
    dVar3 = (this->super_CoordSys).dx[1];
    if (dir == 0) {
      val = dVar3 * dVar2;
    }
    else {
      val = dVar3 * dVar1;
    }
  }
  local_10.vect._0_8_ =
       *(undefined8 *)(area->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect;
  local_10.vect[2] = (area->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[2];
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&area->super_FabArray<amrex::FArrayBox>,val,0,1,&local_10);
  return;
}

Assistant:

bool IsCartesian () const noexcept {
        BL_ASSERT(c_sys != undef); return (c_sys == cartesian);
    }